

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TorsionStamp.hpp
# Opt level: O1

void __thiscall
OpenMD::TorsionStamp::setMembers(TorsionStamp *this,vector<int,_std::allocator<int>_> *members)

{
  ostream *poVar1;
  OpenMDException *this_00;
  vector<int,_std::allocator<int>_> *cont;
  ostringstream oss;
  string local_1b8;
  ostringstream local_198 [376];
  
  std::vector<int,_std::allocator<int>_>::operator=(&this->members_,members);
  if (0xfffffffffffffffd <
      ((long)(this->members_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_finish -
       (long)(this->members_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start >> 2) - 5U) {
    return;
  }
  std::__cxx11::ostringstream::ostringstream(local_198);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_198,"members",7);
  containerToString<std::vector<int,std::allocator<int>>>(&local_1b8,(OpenMD *)members,cont);
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)local_198,local_1b8._M_dataplus._M_p,local_1b8._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1," is invalid",0xb);
  std::endl<char,std::char_traits<char>>(poVar1);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1b8._M_dataplus._M_p != &local_1b8.field_2) {
    operator_delete(local_1b8._M_dataplus._M_p,local_1b8.field_2._M_allocated_capacity + 1);
  }
  this_00 = (OpenMDException *)__cxa_allocate_exception(0x28);
  std::__cxx11::stringbuf::str();
  OpenMDException::OpenMDException(this_00,&local_1b8);
  __cxa_throw(this_00,&OpenMDException::typeinfo,OpenMDException::~OpenMDException);
}

Assistant:

void setMembers(const std::vector<int>& members) {
      members_ = members;
      if (members_.size() < 3 || members_.size() > 4) {
        std::ostringstream oss;
        oss << "members" << containerToString(members) << " is invalid"
            << std::endl;
        throw OpenMDException(oss.str());
      }
    }